

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O3

void MOJOSHADER_effectSetRawValueName
               (MOJOSHADER_effect *effect,char *name,void *data,uint offset,uint len)

{
  int iVar1;
  MOJOSHADER_effectParam *pMVar2;
  int iVar3;
  long lVar4;
  
  iVar1 = effect->param_count;
  if (0 < (long)iVar1) {
    pMVar2 = effect->params;
    lVar4 = 0;
    do {
      iVar3 = strcmp(name,*(char **)((long)&(pMVar2->value).name + lVar4));
      if (iVar3 == 0) {
        memcpy((void *)((ulong)offset + *(long *)((long)&(pMVar2->value).field_4 + lVar4)),data,
               (ulong)len);
        return;
      }
      lVar4 = lVar4 + 0x50;
    } while ((long)iVar1 * 0x50 != lVar4);
  }
  __assert_fail("0 && \"Effect parameter not found!\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                ,0x693,
                "void MOJOSHADER_effectSetRawValueName(const MOJOSHADER_effect *, const char *, const void *, const unsigned int, const unsigned int)"
               );
}

Assistant:

void MOJOSHADER_effectSetRawValueName(const MOJOSHADER_effect *effect,
                                      const char *name,
                                      const void *data,
                                      const unsigned int offset,
                                      const unsigned int len)
{
    int i;
    for (i = 0; i < effect->param_count; i++)
    {
        if (strcmp(name, effect->params[i].value.name) == 0)
        {
            // !!! FIXME: char* case is arbitary, for Win32 -flibit
            memcpy((char *) effect->params[i].value.values + offset, data, len);
            return;
        } // if
    } // for
    assert(0 && "Effect parameter not found!");
}